

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConvexDecomposition.cpp
# Opt level: O3

bool __thiscall
chrono::collision::ChConvexDecompositionHACD::GetConvexHullResult
          (ChConvexDecompositionHACD *this,uint hullIndex,
          vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *convexhull)

{
  Vec3<double> *points;
  ulong uVar1;
  pointer pCVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong numCH;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  size_t *psVar10;
  size_t *psVar11;
  ulong uVar12;
  value_type local_48;
  
  numCH = (ulong)hullIndex;
  uVar1 = this->myHACD->m_nClusters;
  if (numCH <= uVar1) {
    sVar6 = HACD::HACD::GetNPointsCH(this->myHACD,numCH);
    sVar7 = HACD::HACD::GetNTrianglesCH(this->myHACD,numCH);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = sVar7;
    uVar8 = SUB168(auVar4 * ZEXT816(0x18),0);
    uVar12 = uVar8 + 8;
    if (0xfffffffffffffff7 < uVar8) {
      uVar12 = 0xffffffffffffffff;
    }
    auVar5._8_8_ = 0;
    auVar5._0_8_ = sVar6;
    uVar8 = SUB168(auVar5 * ZEXT816(0x18),0);
    if (SUB168(auVar4 * ZEXT816(0x18),8) != 0) {
      uVar12 = 0xffffffffffffffff;
    }
    uVar9 = uVar8 + 8;
    if (0xfffffffffffffff7 < uVar8) {
      uVar9 = 0xffffffffffffffff;
    }
    uVar8 = 0xffffffffffffffff;
    if (SUB168(auVar5 * ZEXT816(0x18),8) == 0) {
      uVar8 = uVar9;
    }
    psVar10 = (size_t *)operator_new__(uVar8);
    *psVar10 = sVar6;
    points = (Vec3<double> *)(psVar10 + 1);
    psVar11 = (size_t *)operator_new__(uVar12);
    *psVar11 = sVar7;
    HACD::HACD::GetCH(this->myHACD,numCH,points,(Vec3<long> *)(psVar11 + 1));
    pCVar2 = (convexhull->
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((convexhull->
        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>).
        _M_impl.super__Vector_impl_data._M_finish != pCVar2) {
      (convexhull->
      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>).
      _M_impl.super__Vector_impl_data._M_finish = pCVar2;
    }
    if (sVar6 != 0) {
      uVar8 = 0;
      uVar12 = 1;
      do {
        local_48.m_data[0] = points[uVar8].m_data[0];
        local_48.m_data[1] = points[uVar8].m_data[1];
        local_48.m_data[2] = (double)psVar10[uVar8 * 3 + 3];
        std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::push_back
                  (convexhull,&local_48);
        bVar3 = uVar12 < sVar6;
        uVar8 = uVar12;
        uVar12 = (ulong)((int)uVar12 + 1);
      } while (bVar3);
    }
    operator_delete__(psVar10,*psVar10 * 0x18 + 8);
    operator_delete__(psVar11,*psVar11 * 0x18 + 8);
  }
  return numCH <= uVar1;
}

Assistant:

bool ChConvexDecompositionHACD::GetConvexHullResult(unsigned int hullIndex,
                                                    std::vector<ChVector<double> >& convexhull) {
    if (hullIndex > myHACD->GetNClusters())
        return false;

    size_t nPoints = myHACD->GetNPointsCH(hullIndex);
    size_t nTriangles = myHACD->GetNTrianglesCH(hullIndex);

    HACD::Vec3<HACD::Real>* pointsCH = new HACD::Vec3<HACD::Real>[nPoints];
    HACD::Vec3<long>* trianglesCH = new HACD::Vec3<long>[nTriangles];
    myHACD->GetCH(hullIndex, pointsCH, trianglesCH);

    // convert to chrono data...
    convexhull.clear();
    for (unsigned int i = 0; i < nPoints; i++) {
        ChVector<double> point(pointsCH[i].X(), pointsCH[i].Y(), pointsCH[i].Z());
        convexhull.push_back(point);
    }

    delete[] pointsCH;
    delete[] trianglesCH;

    return true;
}